

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void * TableSettingsHandler_ReadOpen(ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  short sVar1;
  int iVar2;
  ImGuiTableSettings *pIVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int columns_count;
  ImGuiID id;
  
  pIVar3 = (ImGuiTableSettings *)0x0;
  iVar2 = __isoc99_sscanf(name,"0x%08X,%d");
  if (1 < iVar2) {
    piVar5 = (int *)(GImGui->SettingsTables).Buf.Data;
    piVar6 = piVar5 + 1;
    if (piVar5 != (int *)0x0) {
      piVar4 = piVar6;
      do {
        piVar5 = piVar4;
        if (*piVar5 == 0) break;
        piVar4 = (int *)((long)piVar5 + (long)piVar5[-1]);
        piVar5 = (int *)0x0;
      } while (piVar4 != (int *)((long)piVar6 + (long)(GImGui->SettingsTables).Buf.Size));
    }
    if (piVar5 != (int *)0x0) {
      sVar1 = *(short *)((long)piVar5 + 0xe);
      iVar2 = (int)sVar1;
      if (-1 < iVar2) {
        piVar5[0] = 0;
        piVar5[1] = 0;
        piVar5[2] = 0;
        piVar5[3] = 0;
        piVar5[4] = 0;
        if (0 < sVar1) {
          piVar6 = piVar5 + 5;
          do {
            piVar6[0] = 0;
            piVar6[1] = 0;
            piVar6[2] = -1;
            *(undefined2 *)(piVar6 + 3) = 0xffff;
            *(byte *)((long)piVar6 + 0xe) = *(byte *)((long)piVar6 + 0xe) & 0xf0 | 4;
            piVar6 = piVar6 + 4;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        *piVar5 = 0;
        *(undefined2 *)(piVar5 + 3) = 0;
        *(short *)((long)piVar5 + 0xe) = sVar1;
        *(undefined1 *)(piVar5 + 4) = 1;
        return piVar5;
      }
      *piVar5 = 0;
    }
    pIVar3 = ImGui::TableSettingsCreate(0,0);
  }
  return pIVar3;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            TableSettingsInit(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}